

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapms.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ulong in_RAX;
  char *__ptr;
  size_t sStack_40;
  ulong uStack_38;
  int cnum;
  
  uStack_38 = in_RAX;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    uStack_38 = uStack_38 & 0xffffffff;
    do {
      while (iVar1 = getopt(argc,argv,"c:"), iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar1 != -1);
    if (cnum < nva_cardsnum) {
      timing_pms_waits(cnum);
      return 0;
    }
    if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_40 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_40 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_40 = 0x12;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	timing_pms_waits(cnum);

	return 0;
}